

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakDetectorTest_OneAllocAndFreeUsingArrayNew_TestShell::
~TEST_MemoryLeakDetectorTest_OneAllocAndFreeUsingArrayNew_TestShell
          (TEST_MemoryLeakDetectorTest_OneAllocAndFreeUsingArrayNew_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, OneAllocAndFreeUsingArrayNew)
{
    char* mem = detector->allocMemory(defaultNewArrayAllocator(), 10, "file.cpp", 1234);
    char* mem2 = detector->allocMemory(defaultNewArrayAllocator(), 12);
    LONGS_EQUAL(2, detector->totalMemoryLeaks(mem_leak_period_all));
    SimpleString output = detector->report(mem_leak_period_checking);
    CHECK(output.contains("new []"));
    detector->deallocMemory(defaultNewArrayAllocator(), mem);
    detector->deallocMemory(defaultNewArrayAllocator(), mem2);
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_all));
    detector->stopChecking();
}